

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomWalkUtils.h
# Opt level: O2

OrderedEdgeCollection *
GetEdgesByRandomWalk
          (OrderedEdgeCollection *__return_storage_ptr__,size_type *cg,long params,
          undefined4 param_4)

{
  size_type sVar1;
  OrderedEdgeCollection *pOVar2;
  size_type sVar3;
  result_type rVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  size_type __n;
  byte bVar10;
  reference rVar11;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> edge_list;
  OrderedEdgeCollection *returnEdgeCollection;
  uniform_int_distribution<long> dist_parent_nbor;
  vector<bool,_std::allocator<bool>_> visited_vertex_set;
  vector<bool,_std::allocator<bool>_> visited_edge_set;
  undefined8 auStack_1498 [626];
  undefined4 local_104;
  long local_100;
  long local_f8;
  long local_f0;
  OrderedEdge local_e8;
  _Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_> local_c8;
  OrderedEdgeCollection *local_a8;
  long local_a0;
  long local_98;
  uniform_int_distribution<long> local_90;
  _Bvector_base<std::allocator<bool>_> local_80;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  bVar10 = 0;
  sVar3 = *cg;
  lVar6 = *(long *)(params + 0x20);
  local_100 = *(long *)(params + 0x40);
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_1_ = 0;
  local_104 = param_4;
  local_a8 = __return_storage_ptr__;
  local_a0 = params;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,cg[1],(bool *)&local_80,
             (allocator_type *)&local_e8);
  local_e8.u = local_e8.u & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,sVar3,(bool *)&local_e8,
             (allocator_type *)&local_90);
  lVar5 = 0;
  local_f8 = 0;
  if (0 < local_100) {
    local_f8 = local_100;
  }
  local_f0 = lVar6;
  if (lVar6 < 1) {
    local_f0 = lVar5;
  }
  while (pOVar2 = local_a8, lVar5 != local_f0) {
    sVar3 = *(size_type *)(*(long *)(local_a0 + 0x28) + lVar5 * 8);
    lVar6 = local_f8;
    if (*(long *)(cg[2] + 8 + sVar3 * 8) == *(long *)(cg[2] + sVar3 * 8)) {
      puVar8 = (undefined8 *)&stack0x00000008;
      puVar9 = auStack_1498;
      for (lVar6 = 0x271; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar9 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
        puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
      }
      sVar3 = AlternateSeed(cg);
      lVar6 = local_f8;
    }
    while (local_98 = lVar5, lVar6 != 0) {
      sVar1 = cg[2];
      lVar7 = *(long *)(sVar1 + 8 + sVar3 * 8) - *(long *)(sVar1 + sVar3 * 8);
      local_90._M_param._M_a = 0;
      local_90._M_param._M_b = lVar7 + -1;
      lVar5 = *(long *)(sVar1 + sVar3 * 8);
      rVar4 = std::uniform_int_distribution<long>::operator()
                        (&local_90,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)&stack0x00000008);
      __n = rVar4 + lVar5;
      sVar1 = *(size_type *)(cg[3] + __n * 8);
      local_e8.index = __n;
      if ((char)local_104 == '\0') {
        local_e8.u = sVar3;
        local_e8.v = sVar1;
        local_e8.degree = lVar7;
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&local_c8,&local_e8);
      }
      else {
        lVar5 = *(long *)(cg[2] + 8 + sVar1 * 8) - *(long *)(cg[2] + sVar1 * 8);
        local_e8.degree = lVar5;
        local_e8.u = sVar1;
        local_e8.v = sVar3;
        if ((lVar7 <= lVar5) &&
           (local_e8.degree = lVar7, local_e8.u = sVar3, local_e8.v = sVar1,
           (long)sVar1 < (long)sVar3 && lVar5 == lVar7)) {
          local_e8.u = sVar1;
          local_e8.v = sVar3;
        }
        std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::emplace_back<OrderedEdge>
                  ((vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&local_c8,&local_e8);
      }
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_58,__n);
      *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_80,sVar3);
      *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
      sVar3 = sVar1;
      lVar6 = lVar6 + -1;
      lVar5 = local_98;
    }
    lVar5 = local_98 + 1;
  }
  local_a8->no_of_edges = local_100;
  std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
            (&local_a8->edge_list,(vector<OrderedEdge,_std::allocator<OrderedEdge>_> *)&local_c8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&pOVar2->visited_edge_set,(vector<bool,_std::allocator<bool>_> *)&local_58);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&pOVar2->visited_vertex_set,(vector<bool,_std::allocator<bool>_> *)&local_80);
  pOVar2->no_of_query = local_f0 * local_f8;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_80);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  std::_Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>::~_Vector_base(&local_c8);
  return pOVar2;
}

Assistant:

OrderedEdgeCollection GetEdgesByRandomWalk(CGraph *cg, Parameters params, std::mt19937 mt, bool is_degree_orered = false) {
    /**
     * Setting of various input parameters for executing the algorithm
     */
    VertexIdx n = cg->nVertices;
    EdgeIdx m = cg->nEdges;
    VertexIdx seed_count = params.seed_count; // We are working with only one seed vertex for this project
    EdgeIdx walk_length = params.walk_length;

    /**
     * Data structures for book-keeping and storing the edges found by the random walk
     */
    std::vector<OrderedEdge> edge_list;
    std::vector<bool > visited_edge_set(m,false);
    std::vector<bool > visited_vertex_set(n,false);
    VertexIdx no_of_query = 0;  // Counts the number of query made by the algorithm

    /**
     * Local variables
     */
    VertexIdx parent, child,deg_of_parent, deg_of_child;

    for (VertexIdx sC = 0; sC < seed_count; sC++) {

         VertexIdx seed = params.seed_vertices[sC]; // Random seed vertex is already in the params structure.
            parent = seed;
            deg_of_parent = cg->degree(parent); // degree of parent vertex
            if (deg_of_parent == 0)  // If we are stuck with an isolate vertex, we change the seed
                parent = AlternateSeed(cg,mt);

            for (EdgeIdx wL = 0; wL < walk_length; wL++) { // Perform a random walk of length walk_length from the seed vertex and collect the edges
                deg_of_parent = cg->degree(parent); // degree of parent vertex
                std::uniform_int_distribution<VertexIdx> dist_parent_nbor(0, deg_of_parent - 1);
                EdgeIdx random_nbor_edge = cg->offsets[parent] + dist_parent_nbor(mt); // TODO: check randomness. same seeding ok?
                no_of_query++; // One query to the uniform random neighbor oracle
                child = cg->nbors[random_nbor_edge]; // child is the next vertex on the random walk
                deg_of_child = cg->degree(child); //degree of child vertex

                /**
                 * Update the edge collection data structure with relevant information about the edge
                 */
                if (is_degree_orered) {
                    VertexIdx u, v, low_deg;
                    if (deg_of_child < deg_of_parent || (deg_of_child == deg_of_parent && child < parent)) {
                        u = child;
                        v = parent;
                        low_deg = deg_of_child;
                    } else {
                        u = parent;
                        v = child;
                        low_deg = deg_of_parent;
                    }
                    edge_list.push_back(OrderedEdge{u, v, random_nbor_edge, low_deg});
                }
                else {
                    edge_list.push_back(OrderedEdge{parent, child, random_nbor_edge, deg_of_parent});
                }

                /**
                 * Update the book-keeping data structure with the visited edge and vertices
                 */
                visited_edge_set[random_nbor_edge] = true;
                visited_vertex_set[parent] = true;
                parent = child; // The random walk proceeds with the vertex child
            }
        }

    OrderedEdgeCollection returnEdgeCollection = {walk_length, edge_list, visited_edge_set, visited_vertex_set,no_of_query};
    return returnEdgeCollection;
}